

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
ui::Renderable::payload<gamespace::EndingScreen::load_ui()::__2&>
          (Renderable *this,anon_class_1_0_00000001 *d)

{
  anon_class_1_0_00000001 *d_local;
  Renderable *this_local;
  
  std::function<void(void*)>::operator=((function<void(void*)> *)&this->_deleter,d);
  return;
}

Assistant:

void payload(F &&d) {
            _deleter = d;
        }